

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_dup(bssl *this,SSL_SESSION *session,int dup_flags)

{
  byte bVar1;
  CRYPTO_BUFFER *pCVar2;
  uchar *puVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var8;
  byte bVar9;
  bool bVar10;
  ssl_session_st *psVar11;
  char *pcVar12;
  OPENSSL_STACK *pOVar13;
  ptrdiff_t _Num_1;
  Array<unsigned_char> *pAVar14;
  ptrdiff_t _Num;
  ptrdiff_t _Num_4;
  pointer __p;
  UniquePtr<SSL_SESSION> new_session;
  _Head_base<0UL,_ssl_session_st_*,_false> local_48;
  uint local_3c;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_38;
  
  local_38._M_head_impl = (crypto_buffer_st *)session->x509_method;
  local_3c = dup_flags;
  psVar11 = New<ssl_session_st,bssl::SSL_X509_METHOD_const*&>((SSL_X509_METHOD **)&local_38);
  local_48._M_head_impl = psVar11;
  if (psVar11 != (ssl_session_st *)0x0) {
    bVar9 = session->field_0x1b8 & 0x10;
    bVar1 = psVar11->field_0x1b8;
    psVar11->field_0x1b8 = bVar1 & 0xef | bVar9;
    psVar11->ssl_version = session->ssl_version;
    psVar11->field_0x1b8 = bVar1 & 0xcf | bVar9 | session->field_0x1b8 & 0x20;
    if (psVar11 != session) {
      bVar1 = (session->sid_ctx).size_;
      if (0x20 < (ulong)bVar1) goto LAB_0015f790;
      (psVar11->sid_ctx).size_ = '\0';
      if (bVar1 != 0) {
        memmove(&psVar11->sid_ctx,&session->sid_ctx,(ulong)bVar1);
      }
      (psVar11->sid_ctx).size_ = bVar1;
    }
    if (psVar11 != session) {
      bVar1 = (session->secret).size_;
      if (0x40 < (ulong)bVar1) goto LAB_0015f790;
      (psVar11->secret).size_ = '\0';
      if (bVar1 != 0) {
        memmove(&psVar11->secret,&session->secret,(ulong)bVar1);
      }
      (psVar11->secret).size_ = bVar1;
    }
    psVar11->cipher = session->cipher;
    pcVar12 = (session->psk_identity)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t
              .super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (pcVar12 != (char *)0x0) {
      pcVar12 = OPENSSL_strdup(pcVar12);
      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&psVar11->psk_identity,pcVar12);
      if (((local_48._M_head_impl)->psk_identity)._M_t.
          super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) goto LAB_0015f76f;
    }
    _Var8._M_head_impl = local_48._M_head_impl;
    pOVar13 = (OPENSSL_STACK *)
              (session->certs)._M_t.
              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (pOVar13 != (OPENSSL_STACK *)0x0) {
      pOVar13 = OPENSSL_sk_deep_copy
                          (pOVar13,sk_CRYPTO_BUFFER_call_copy_func,
                           SSL_SESSION_dup::anon_class_1_0_00000001::__invoke,
                           sk_CRYPTO_BUFFER_call_free_func,CRYPTO_BUFFER_free);
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                 &(_Var8._M_head_impl)->certs,(pointer)pOVar13);
      if (((local_48._M_head_impl)->certs)._M_t.
          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
          (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_0015f76f;
    }
    bVar10 = (*session->x509_method->session_dup)(local_48._M_head_impl,session);
    if (bVar10) {
      (local_48._M_head_impl)->verify_result = session->verify_result;
      pCVar2 = (session->ocsp_response)._M_t.
               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      if (pCVar2 != (CRYPTO_BUFFER *)0x0) {
        CRYPTO_BUFFER_up_ref(pCVar2);
      }
      local_38._M_head_impl = (crypto_buffer_st *)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_48._M_head_impl)->ocsp_response,pCVar2);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
      pCVar2 = (session->signed_cert_timestamp_list)._M_t.
               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      if (pCVar2 != (CRYPTO_BUFFER *)0x0) {
        CRYPTO_BUFFER_up_ref(pCVar2);
      }
      local_38._M_head_impl = (crypto_buffer_st *)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_48._M_head_impl)->signed_cert_timestamp_list,pCVar2);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
      _Var8._M_head_impl = local_48._M_head_impl;
      uVar5 = *(undefined8 *)session->peer_sha256;
      uVar6 = *(undefined8 *)(session->peer_sha256 + 8);
      uVar7 = *(undefined8 *)(session->peer_sha256 + 0x18);
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 0x10) =
           *(undefined8 *)(session->peer_sha256 + 0x10);
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 0x18) = uVar7;
      *(undefined8 *)(local_48._M_head_impl)->peer_sha256 = uVar5;
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 8) = uVar6;
      (local_48._M_head_impl)->field_0x1b8 =
           (local_48._M_head_impl)->field_0x1b8 & 0xfd | session->field_0x1b8 & 2;
      (local_48._M_head_impl)->peer_signature_algorithm = session->peer_signature_algorithm;
      (local_48._M_head_impl)->timeout = session->timeout;
      (local_48._M_head_impl)->auth_timeout = session->auth_timeout;
      (local_48._M_head_impl)->time = session->time;
      if ((local_3c & 2) == 0) {
LAB_0015f503:
        if ((local_3c & 1) != 0) {
          puVar3 = (session->ticket).data_;
          sVar4 = (session->ticket).size_;
          pAVar14 = &(local_48._M_head_impl)->ticket;
          bVar10 = Array<unsigned_char>::InitUninitialized(pAVar14,sVar4);
          if (bVar10 && sVar4 != 0) {
            memmove(pAVar14->data_,puVar3,sVar4);
          }
          if (!bVar10) goto LAB_0015f76f;
        }
        (local_48._M_head_impl)->field_0x1b8 = (local_48._M_head_impl)->field_0x1b8 | 4;
        *(ssl_session_st **)this = local_48._M_head_impl;
        local_48._M_head_impl = (ssl_session_st *)0x0;
        goto LAB_0015f776;
      }
      if (local_48._M_head_impl != session) {
        bVar1 = (session->session_id).size_;
        if (0x20 < (ulong)bVar1) goto LAB_0015f790;
        ((local_48._M_head_impl)->session_id).size_ = '\0';
        if (bVar1 != 0) {
          memmove(&(local_48._M_head_impl)->session_id,&session->session_id,(ulong)bVar1);
        }
        ((_Var8._M_head_impl)->session_id).size_ = bVar1;
      }
      (_Var8._M_head_impl)->group_id = session->group_id;
      if (_Var8._M_head_impl != session) {
        bVar1 = (session->original_handshake_hash).size_;
        if (0x40 < (ulong)bVar1) {
LAB_0015f790:
          abort();
        }
        ((_Var8._M_head_impl)->original_handshake_hash).size_ = '\0';
        if (bVar1 != 0) {
          memmove(&(_Var8._M_head_impl)->original_handshake_hash,&session->original_handshake_hash,
                  (ulong)bVar1);
        }
        ((_Var8._M_head_impl)->original_handshake_hash).size_ = bVar1;
      }
      (_Var8._M_head_impl)->ticket_lifetime_hint = session->ticket_lifetime_hint;
      (_Var8._M_head_impl)->ticket_age_add = session->ticket_age_add;
      (_Var8._M_head_impl)->ticket_max_early_data = session->ticket_max_early_data;
      bVar9 = session->field_0x1b8 & 1;
      bVar1 = (_Var8._M_head_impl)->field_0x1b8;
      (_Var8._M_head_impl)->field_0x1b8 = bVar1 & 0xfe | bVar9;
      (_Var8._M_head_impl)->field_0x1b8 = bVar1 & 0xbe | bVar9 | session->field_0x1b8 & 0x40;
      puVar3 = (session->early_alpn).data_;
      sVar4 = (session->early_alpn).size_;
      bVar10 = Array<unsigned_char>::InitUninitialized(&(_Var8._M_head_impl)->early_alpn,sVar4);
      if (bVar10 && sVar4 != 0) {
        memmove(((_Var8._M_head_impl)->early_alpn).data_,puVar3,sVar4);
      }
      if (bVar10) {
        puVar3 = (session->quic_early_data_context).data_;
        sVar4 = (session->quic_early_data_context).size_;
        pAVar14 = &(local_48._M_head_impl)->quic_early_data_context;
        bVar10 = Array<unsigned_char>::InitUninitialized(pAVar14,sVar4);
        if (bVar10 && sVar4 != 0) {
          memmove(pAVar14->data_,puVar3,sVar4);
        }
        if (bVar10) {
          puVar3 = (session->local_application_settings).data_;
          sVar4 = (session->local_application_settings).size_;
          pAVar14 = &(local_48._M_head_impl)->local_application_settings;
          bVar10 = Array<unsigned_char>::InitUninitialized(pAVar14,sVar4);
          if (bVar10 && sVar4 != 0) {
            memmove(pAVar14->data_,puVar3,sVar4);
          }
          if (bVar10) {
            puVar3 = (session->peer_application_settings).data_;
            sVar4 = (session->peer_application_settings).size_;
            pAVar14 = &(local_48._M_head_impl)->peer_application_settings;
            bVar10 = Array<unsigned_char>::InitUninitialized(pAVar14,sVar4);
            if (bVar10 && sVar4 != 0) {
              memmove(pAVar14->data_,puVar3,sVar4);
            }
            if (bVar10) goto LAB_0015f503;
          }
        }
      }
    }
  }
LAB_0015f76f:
  *(undefined8 *)this = 0;
LAB_0015f776:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_dup(SSL_SESSION *session, int dup_flags) {
  UniquePtr<SSL_SESSION> new_session = ssl_session_new(session->x509_method);
  if (!new_session) {
    return nullptr;
  }

  new_session->is_server = session->is_server;
  new_session->ssl_version = session->ssl_version;
  new_session->is_quic = session->is_quic;
  new_session->sid_ctx = session->sid_ctx;

  // Copy the key material.
  new_session->secret = session->secret;
  new_session->cipher = session->cipher;

  // Copy authentication state.
  if (session->psk_identity != nullptr) {
    new_session->psk_identity.reset(
        OPENSSL_strdup(session->psk_identity.get()));
    if (new_session->psk_identity == nullptr) {
      return nullptr;
    }
  }
  if (session->certs != nullptr) {
    auto buf_up_ref = [](const CRYPTO_BUFFER *buf) {
      CRYPTO_BUFFER_up_ref(const_cast<CRYPTO_BUFFER *>(buf));
      return const_cast<CRYPTO_BUFFER *>(buf);
    };
    new_session->certs.reset(sk_CRYPTO_BUFFER_deep_copy(
        session->certs.get(), buf_up_ref, CRYPTO_BUFFER_free));
    if (new_session->certs == nullptr) {
      return nullptr;
    }
  }

  if (!session->x509_method->session_dup(new_session.get(), session)) {
    return nullptr;
  }

  new_session->verify_result = session->verify_result;

  new_session->ocsp_response = UpRef(session->ocsp_response);
  new_session->signed_cert_timestamp_list =
      UpRef(session->signed_cert_timestamp_list);

  OPENSSL_memcpy(new_session->peer_sha256, session->peer_sha256,
                 SHA256_DIGEST_LENGTH);
  new_session->peer_sha256_valid = session->peer_sha256_valid;

  new_session->peer_signature_algorithm = session->peer_signature_algorithm;

  new_session->timeout = session->timeout;
  new_session->auth_timeout = session->auth_timeout;
  new_session->time = session->time;

  // Copy non-authentication connection properties.
  if (dup_flags & SSL_SESSION_INCLUDE_NONAUTH) {
    new_session->session_id = session->session_id;
    new_session->group_id = session->group_id;
    new_session->original_handshake_hash = session->original_handshake_hash;
    new_session->ticket_lifetime_hint = session->ticket_lifetime_hint;
    new_session->ticket_age_add = session->ticket_age_add;
    new_session->ticket_max_early_data = session->ticket_max_early_data;
    new_session->extended_master_secret = session->extended_master_secret;
    new_session->has_application_settings = session->has_application_settings;

    if (!new_session->early_alpn.CopyFrom(session->early_alpn) ||
        !new_session->quic_early_data_context.CopyFrom(
            session->quic_early_data_context) ||
        !new_session->local_application_settings.CopyFrom(
            session->local_application_settings) ||
        !new_session->peer_application_settings.CopyFrom(
            session->peer_application_settings)) {
      return nullptr;
    }
  }

  // Copy the ticket.
  if (dup_flags & SSL_SESSION_INCLUDE_TICKET &&
      !new_session->ticket.CopyFrom(session->ticket)) {
    return nullptr;
  }

  // The new_session does not get a copy of the ex_data.

  new_session->not_resumable = true;
  return new_session;
}